

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

int64_t __thiscall
spvtools::opt::Loop::GetIterations
          (Loop *this,Op condition,int64_t condition_value,int64_t init_value,int64_t step_value)

{
  long local_48;
  int64_t result;
  int64_t diff;
  int64_t step_value_local;
  int64_t init_value_local;
  int64_t condition_value_local;
  Op condition_local;
  Loop *this_local;
  
  if (step_value == 0) {
    return 0;
  }
  switch(condition) {
  case OpUGreaterThan:
  case OpSGreaterThan:
    if (init_value <= condition_value) {
      return 0;
    }
    result = init_value - condition_value;
    if (((result < 0) && (step_value < 0)) || ((0 < result && (0 < step_value)))) {
      return 0;
    }
    break;
  case OpUGreaterThanEqual:
  case OpSGreaterThanEqual:
    if (init_value < condition_value) {
      return 0;
    }
    result = init_value - (condition_value + -1);
    if (((0 < result) && (0 < step_value)) || ((result < 0 && (step_value < 0)))) {
      return 0;
    }
    break;
  case OpULessThan:
  case OpSLessThan:
    if (condition_value <= init_value) {
      return 0;
    }
    result = condition_value - init_value;
    if (((result < 0) && (0 < step_value)) || ((0 < result && (step_value < 0)))) {
      return 0;
    }
    break;
  case OpULessThanEqual:
  case OpSLessThanEqual:
    if (condition_value < init_value) {
      return 0;
    }
    result = (condition_value + 1) - init_value;
    if (((result < 0) && (0 < step_value)) || ((0 < result && (step_value < 0)))) {
      return 0;
    }
    break;
  default:
    __assert_fail("false && \"Could not retrieve number of iterations from the loop condition. \" \"Condition is not supported.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x340,
                  "int64_t spvtools::opt::Loop::GetIterations(spv::Op, int64_t, int64_t, int64_t) const"
                 );
  }
  if (step_value < 1) {
    step_value = -step_value;
  }
  if (result < 1) {
    result = -result;
  }
  local_48 = result / step_value;
  if (result % step_value != 0) {
    local_48 = local_48 + 1;
  }
  return local_48;
}

Assistant:

int64_t Loop::GetIterations(spv::Op condition, int64_t condition_value,
                            int64_t init_value, int64_t step_value) const {
  if (step_value == 0) {
    return 0;
  }

  int64_t diff = 0;

  switch (condition) {
    case spv::Op::OpSLessThan:
    case spv::Op::OpULessThan: {
      // If the condition is not met to begin with the loop will never iterate.
      if (!(init_value < condition_value)) return 0;

      diff = condition_value - init_value;

      // If the operation is a less then operation then the diff and step must
      // have the same sign otherwise the induction will never cross the
      // condition (either never true or always true).
      if ((diff < 0 && step_value > 0) || (diff > 0 && step_value < 0)) {
        return 0;
      }

      break;
    }
    case spv::Op::OpSGreaterThan:
    case spv::Op::OpUGreaterThan: {
      // If the condition is not met to begin with the loop will never iterate.
      if (!(init_value > condition_value)) return 0;

      diff = init_value - condition_value;

      // If the operation is a greater than operation then the diff and step
      // must have opposite signs. Otherwise the condition will always be true
      // or will never be true.
      if ((diff < 0 && step_value < 0) || (diff > 0 && step_value > 0)) {
        return 0;
      }

      break;
    }

    case spv::Op::OpSGreaterThanEqual:
    case spv::Op::OpUGreaterThanEqual: {
      // If the condition is not met to begin with the loop will never iterate.
      if (!(init_value >= condition_value)) return 0;

      // We subtract one to make it the same as spv::Op::OpGreaterThan as it is
      // functionally equivalent.
      diff = init_value - (condition_value - 1);

      // If the operation is a greater than operation then the diff and step
      // must have opposite signs. Otherwise the condition will always be true
      // or will never be true.
      if ((diff > 0 && step_value > 0) || (diff < 0 && step_value < 0)) {
        return 0;
      }

      break;
    }

    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpULessThanEqual: {
      // If the condition is not met to begin with the loop will never iterate.
      if (!(init_value <= condition_value)) return 0;

      // We add one to make it the same as spv::Op::OpLessThan as it is
      // functionally equivalent.
      diff = (condition_value + 1) - init_value;

      // If the operation is a less than operation then the diff and step must
      // have the same sign otherwise the induction will never cross the
      // condition (either never true or always true).
      if ((diff < 0 && step_value > 0) || (diff > 0 && step_value < 0)) {
        return 0;
      }

      break;
    }

    default:
      assert(false &&
             "Could not retrieve number of iterations from the loop condition. "
             "Condition is not supported.");
  }

  // Take the abs of - step values.
  step_value = llabs(step_value);
  diff = llabs(diff);
  int64_t result = diff / step_value;

  if (diff % step_value != 0) {
    result += 1;
  }
  return result;
}